

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O1

void __thiscall wasm::WasmSplitOptions::WasmSplitOptions(WasmSplitOptions *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  __node_base_ptr *pp_Var4;
  long lVar5;
  initializer_list<wasm::WasmSplitOptions::Mode> __l;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_00;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_01;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_02;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_03;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_04;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_05;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_06;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_07;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_08;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_09;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_10;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_11;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_12;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_13;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_14;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_15;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_16;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_17;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_18;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_19;
  Mode local_1078 [12];
  _Any_data local_1048;
  code *local_1038;
  code *pcStack_1030;
  _Any_data local_1028;
  code *local_1018;
  code *pcStack_1010;
  _Any_data local_1008;
  code *local_ff8;
  code *pcStack_ff0;
  _Any_data local_fe8;
  code *local_fd8;
  code *pcStack_fd0;
  _Any_data local_fc8;
  code *local_fb8;
  code *pcStack_fb0;
  _Any_data local_fa8;
  code *local_f98;
  code *pcStack_f90;
  _Any_data local_f88;
  code *local_f78;
  code *pcStack_f70;
  _Any_data local_f68;
  code *local_f58;
  code *pcStack_f50;
  _Any_data local_f48;
  code *local_f38;
  code *pcStack_f30;
  _Any_data local_f28;
  code *local_f18;
  code *pcStack_f10;
  _Any_data local_f08;
  code *local_ef8;
  code *pcStack_ef0;
  _Any_data local_ee8;
  code *local_ed8;
  code *pcStack_ed0;
  _Any_data local_ec8;
  code *local_eb8;
  code *pcStack_eb0;
  _Any_data local_ea8;
  code *local_e98;
  code *pcStack_e90;
  _Any_data local_e88;
  code *local_e78;
  code *pcStack_e70;
  _Any_data local_e68;
  code *local_e58;
  code *pcStack_e50;
  _Any_data local_e48;
  code *local_e38;
  code *pcStack_e30;
  _Any_data local_e28;
  code *local_e18;
  code *pcStack_e10;
  _Any_data local_e08;
  code *local_df8;
  code *pcStack_df0;
  _Any_data local_de8;
  code *local_dd8;
  code *pcStack_dd0;
  _Any_data local_dc8;
  code *local_db8;
  code *pcStack_db0;
  _Any_data local_da8;
  code *local_d98;
  code *pcStack_d90;
  _Any_data local_d88;
  code *local_d78;
  code *pcStack_d70;
  _Any_data local_d68;
  code *local_d58;
  code *pcStack_d50;
  _Any_data local_d48;
  code *local_d38;
  code *pcStack_d30;
  _Any_data local_d28;
  code *local_d18;
  code *pcStack_d10;
  WasmSplitOptions *local_d08;
  undefined8 uStack_d00;
  code *local_cf8;
  code *pcStack_cf0;
  string local_ce0;
  string local_cc0;
  string local_ca0;
  long *local_c80 [2];
  long local_c70 [2];
  Mode local_c5c [15];
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c20;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c08;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_bf0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_bd8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_bc0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_ba8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_b90;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_b78;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_b60;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_b48;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_b30;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_b18;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_b00;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_ae8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_ad0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_ab8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_aa0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_a88;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_a70;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_a58;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_a40;
  string *local_a28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a20;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string local_90;
  allocator_type local_6d;
  allocator_type local_6c;
  allocator_type local_6b;
  allocator_type local_6a;
  allocator_type local_69;
  allocator_type local_68;
  allocator_type local_67;
  allocator_type local_66;
  allocator_type local_65;
  allocator_type local_64;
  allocator_type local_63;
  allocator_type local_62;
  allocator_type local_61;
  allocator_type local_60;
  allocator_type local_5f;
  allocator_type local_5e;
  allocator_type local_5d;
  allocator_type local_5c;
  allocator_type local_5b;
  allocator_type local_5a;
  allocator_type local_59;
  undefined1 local_58 [8];
  string WasmSplitOption;
  
  psVar1 = &WasmSplitOption._M_string_length;
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"wasm-split","");
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "Split a module into a primary module and a secondary module, or instrument a module to gather a profile that can inform future splitting, or manage such profiles. Options that are only accepted in particular modes are marked with the accepted \"[<modes>]\" in their descriptions."
             ,"");
  ToolOptions::ToolOptions(&this->super_ToolOptions,(string *)local_58,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58,WasmSplitOption._M_string_length + 1);
  }
  this->mode = Split;
  this->storageKind = InGlobals;
  this->unescape = false;
  this->verbose = false;
  this->emitBinary = true;
  local_d8 = &(this->profileFile).field_2;
  this->symbolMap = false;
  this->placeholderMap = false;
  this->jspi = false;
  this->emitModuleNames = false;
  (this->profileFile)._M_dataplus._M_p = (pointer)local_d8;
  (this->profileFile)._M_string_length = 0;
  (this->profileFile).field_2._M_local_buf[0] = '\0';
  local_d0 = &(this->profileExport).field_2;
  (this->profileExport)._M_dataplus._M_p = (pointer)local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->profileExport,DEFAULT_PROFILE_EXPORT_abi_cxx11_,
             DAT_0012b450 + DEFAULT_PROFILE_EXPORT_abi_cxx11_);
  p_Var3 = &(this->keepFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->splitFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  local_a20 = &this->inputFiles;
  local_c8 = &(this->output).field_2;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->output)._M_dataplus._M_p = (pointer)local_c8;
  (this->output)._M_string_length = 0;
  (this->output).field_2._M_local_buf[0] = '\0';
  local_c0 = &(this->primaryOutput).field_2;
  (this->primaryOutput)._M_dataplus._M_p = (pointer)local_c0;
  (this->primaryOutput)._M_string_length = 0;
  (this->primaryOutput).field_2._M_local_buf[0] = '\0';
  local_b8 = &(this->secondaryOutput).field_2;
  (this->secondaryOutput)._M_dataplus._M_p = (pointer)local_b8;
  (this->secondaryOutput)._M_string_length = 0;
  (this->secondaryOutput).field_2._M_local_buf[0] = '\0';
  local_b0 = &(this->importNamespace).field_2;
  (this->importNamespace)._M_dataplus._M_p = (pointer)local_b0;
  (this->importNamespace)._M_string_length = 0;
  (this->importNamespace).field_2._M_local_buf[0] = '\0';
  local_a8 = &(this->placeholderNamespace).field_2;
  (this->placeholderNamespace)._M_dataplus._M_p = (pointer)local_a8;
  (this->placeholderNamespace)._M_string_length = 0;
  (this->placeholderNamespace).field_2._M_local_buf[0] = '\0';
  local_a0 = &(this->secondaryMemoryName).field_2;
  (this->secondaryMemoryName)._M_dataplus._M_p = (pointer)local_a0;
  (this->secondaryMemoryName)._M_string_length = 0;
  (this->secondaryMemoryName).field_2._M_local_buf[0] = '\0';
  local_98 = &(this->exportPrefix).field_2;
  (this->exportPrefix)._M_dataplus._M_p = (pointer)local_98;
  (this->exportPrefix)._M_string_length = 0;
  (this->exportPrefix).field_2._M_local_buf[0] = '\0';
  this->initialTableSize = -1;
  pp_Var4 = &(this->validOptions)._M_elems[0]._M_h._M_single_bucket;
  lVar5 = 0xe0;
  do {
    ((_Hashtable *)(pp_Var4 + -6))->_M_buckets = pp_Var4;
    pp_Var4[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var4 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var4[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var4 + -2))->_M_max_load_factor = 1.0;
    pp_Var4[-1] = (__node_base_ptr)0x0;
    *pp_Var4 = (__node_base_ptr)0x0;
    pp_Var4 = pp_Var4 + 7;
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != 0);
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a28 = &this->profileExport;
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"wasm-split options","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--split","");
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"");
  local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9f8,"Split an input module into two output modules. The default mode."
             ,"");
  local_1048._8_8_ = 0;
  pcStack_1030 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:94:10)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:94:10)>
               ::_M_manager;
  local_1048._M_unused._M_object = this;
  add(this,&local_90,&local_a18,&local_9f8,(string *)local_58,Zero,(Action *)&local_1048);
  local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"--instrument","");
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"");
  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_998,
             "Instrument an input module to allow it to generate a profile that can be used to guide splitting."
             ,"");
  local_1028._8_8_ = 0;
  pcStack_1010 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:102:7)>
                 ::_M_invoke;
  local_1018 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:102:7)>
               ::_M_manager;
  local_1028._M_unused._M_object = this;
  add(this,&local_9d8,&local_9b8,&local_998,(string *)local_58,Zero,(Action *)&local_1028);
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,"--merge-profiles","");
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"");
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_938,
             "Merge multiple profiles for the same module into a single profile.","");
  local_1008._8_8_ = 0;
  pcStack_ff0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:108:10)>
                ::_M_invoke;
  local_ff8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:108:10)>
              ::_M_manager;
  local_1008._M_unused._M_object = this;
  add(this,&local_978,&local_958,&local_938,(string *)local_58,Zero,(Action *)&local_1008);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"--print-profile","");
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"");
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8d8,"Print profile contents in a human-readable format.","");
  local_c5c[0] = PrintProfile;
  __l._M_len = 1;
  __l._M_array = local_c5c;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c20,__l,&local_6d);
  local_fe8._8_8_ = 0;
  pcStack_fd0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:117:10)>
                ::_M_invoke;
  local_fd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:117:10)>
              ::_M_manager;
  local_fe8._M_unused._M_object = this;
  add(this,&local_918,&local_8f8,&local_8d8,(string *)local_58,&local_c20,One,(Action *)&local_fe8);
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"--profile","");
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"");
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_878,"The profile to use to guide splitting.","");
  local_c5c[1] = 0;
  __l_00._M_len = 1;
  __l_00._M_array = local_c5c + 1;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c08,__l_00,&local_6c);
  local_fc8._8_8_ = 0;
  pcStack_fb0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:128:7)>
                ::_M_invoke;
  local_fb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:128:7)>
              ::_M_manager;
  local_fc8._M_unused._M_object = this;
  add(this,&local_8b8,&local_898,&local_878,(string *)local_58,&local_c08,One,(Action *)&local_fc8);
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"--keep-funcs","");
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"");
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_818,
             "Comma-separated list of functions to keep in the primary module. The rest will be split out. Cannot be used with --profile or --split-funcs. You can also pass a file with one function per line by passing @filename."
             ,"");
  local_c5c[2] = 0;
  __l_01._M_len = 1;
  __l_01._M_array = local_c5c + 2;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_bf0,__l_01,&local_6b);
  local_fa8._8_8_ = 0;
  pcStack_f90 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:138:10)>
                ::_M_invoke;
  local_f98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:138:10)>
              ::_M_manager;
  local_fa8._M_unused._M_object = this;
  add(this,&local_858,&local_838,&local_818,(string *)local_58,&local_bf0,One,(Action *)&local_fa8);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"--split-funcs","");
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b8,
             "Comma-separated list of functions to split out to the secondary module. The rest will be kept. Cannot be used with --profile or --keep-funcs. You can also pass a file with one function per line by passing @filename."
             ,"");
  local_c5c[3] = 0;
  __l_02._M_len = 1;
  __l_02._M_array = local_c5c + 3;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_bd8,__l_02,&local_6a);
  local_f88._8_8_ = 0;
  pcStack_f70 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:150:10)>
                ::_M_invoke;
  local_f78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:150:10)>
              ::_M_manager;
  local_f88._M_unused._M_object = this;
  add(this,&local_7f8,&local_7d8,&local_7b8,(string *)local_58,&local_bd8,One,(Action *)&local_f88);
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"--primary-output","");
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"-o1","");
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_758,"Output file for the primary module.","");
  local_c5c[4] = 0;
  __l_03._M_len = 1;
  __l_03._M_array = local_c5c + 4;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_bc0,__l_03,&local_69);
  local_f68._8_8_ = 0;
  pcStack_f50 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:159:10)>
                ::_M_invoke;
  local_f58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:159:10)>
              ::_M_manager;
  local_f68._M_unused._M_object = this;
  add(this,&local_798,&local_778,&local_758,(string *)local_58,&local_bc0,One,(Action *)&local_f68);
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"--secondary-output","");
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"-o2","");
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,"Output file for the secondary module.","");
  local_c5c[5] = 0;
  __l_04._M_len = 1;
  __l_04._M_array = local_c5c + 5;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_ba8,__l_04,&local_68);
  local_f48._8_8_ = 0;
  pcStack_f30 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:168:10)>
                ::_M_invoke;
  local_f38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:168:10)>
              ::_M_manager;
  local_f48._M_unused._M_object = this;
  add(this,&local_738,&local_718,&local_6f8,(string *)local_58,&local_ba8,One,(Action *)&local_f48);
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"--symbolmap","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"");
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_698,"Write a symbol map file for each of the output modules.","");
  local_c5c[6] = 0;
  __l_05._M_len = 1;
  __l_05._M_array = local_c5c + 6;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_b90,__l_05,&local_67);
  local_f28._8_8_ = 0;
  pcStack_f10 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:177:10)>
                ::_M_invoke;
  local_f18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:177:10)>
              ::_M_manager;
  local_f28._M_unused._M_object = this;
  add(this,&local_6d8,&local_6b8,&local_698,(string *)local_58,&local_b90,Zero,(Action *)&local_f28)
  ;
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"--placeholdermap","");
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"");
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_638,"Write a file mapping placeholder indices to the function names.",
             "");
  local_c5c[7] = 0;
  __l_06._M_len = 1;
  __l_06._M_array = local_c5c + 7;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_b78,__l_06,&local_66);
  local_f08._8_8_ = 0;
  pcStack_ef0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:185:7)>
                ::_M_invoke;
  local_ef8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:185:7)>
              ::_M_manager;
  local_f08._M_unused._M_object = this;
  add(this,&local_678,&local_658,&local_638,(string *)local_58,&local_b78,Zero,(Action *)&local_f08)
  ;
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"--import-namespace","");
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"");
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d8,
             "When provided as an option for module splitting, the namespace from which to import objects from the primary module into the secondary module. In instrument mode, refers to the namespace from which to import the secondary memory, if any."
             ,"");
  local_1078[0] = Split;
  local_1078[1] = Instrument;
  __l_07._M_len = 2;
  __l_07._M_array = local_1078;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_b60,__l_07,&local_65);
  local_ee8._8_8_ = 0;
  pcStack_ed0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:195:10)>
                ::_M_invoke;
  local_ed8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:195:10)>
              ::_M_manager;
  local_ee8._M_unused._M_object = this;
  add(this,&local_618,&local_5f8,&local_5d8,(string *)local_58,&local_b60,One,(Action *)&local_ee8);
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"--placeholder-namespace","")
  ;
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"");
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_578,
             "The namespace from which to import placeholder functions into the primary module.","")
  ;
  local_c5c[8] = 0;
  __l_08._M_len = 1;
  __l_08._M_array = local_c5c + 8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_b48,__l_08,&local_64);
  local_ec8._8_8_ = 0;
  pcStack_eb0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:205:10)>
                ::_M_invoke;
  local_eb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:205:10)>
              ::_M_manager;
  local_ec8._M_unused._M_object = this;
  add(this,&local_5b8,&local_598,&local_578,(string *)local_58,&local_b48,One,(Action *)&local_ec8);
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"--jspi","");
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"");
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_518,
             "Transform the module to support asynchronously loading the secondary module before any placeholder functions have been called."
             ,"");
  local_c5c[9] = 0;
  __l_09._M_len = 1;
  __l_09._M_array = local_c5c + 9;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_b30,__l_09,&local_63);
  local_ea8._8_8_ = 0;
  pcStack_e90 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:215:10)>
                ::_M_invoke;
  local_e98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:215:10)>
              ::_M_manager;
  local_ea8._M_unused._M_object = this;
  add(this,&local_558,&local_538,&local_518,(string *)local_58,&local_b30,Zero,(Action *)&local_ea8)
  ;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"--export-prefix","");
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b8,
             "An identifying prefix to prepend to new export names created by module splitting.","")
  ;
  local_c5c[10] = 0;
  __l_10._M_len = 1;
  __l_10._M_array = local_c5c + 10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_b18,__l_10,&local_62);
  local_e88._8_8_ = 0;
  pcStack_e70 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:224:7)>
                ::_M_invoke;
  local_e78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:224:7)>
              ::_M_manager;
  local_e88._M_unused._M_object = this;
  add(this,&local_4f8,&local_4d8,&local_4b8,(string *)local_58,&local_b18,One,(Action *)&local_e88);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"--profile-export","");
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_458,
             "The export name of the function the embedder calls to write the profile into memory. Defaults to `__write_profile`."
             ,"");
  local_c5c[0xb] = 1;
  __l_11._M_len = 1;
  __l_11._M_array = local_c5c + 0xb;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_b00,__l_11,&local_61);
  local_e68._8_8_ = 0;
  pcStack_e50 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:232:10)>
                ::_M_invoke;
  local_e58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:232:10)>
              ::_M_manager;
  local_e68._M_unused._M_object = this;
  add(this,&local_498,&local_478,&local_458,(string *)local_58,&local_b00,One,(Action *)&local_e68);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"--in-memory","");
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f8,
             "Store profile information in memory (starting at address 0 and taking one byte per function) rather than globals (the default) so that it can be shared between multiple threads. Users are responsible for ensuring that the module does not use the initial memory region for anything else."
             ,"");
  local_c5c[0xc] = 1;
  __l_12._M_len = 1;
  __l_12._M_array = local_c5c + 0xc;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_ae8,__l_12,&local_60);
  local_e48._8_8_ = 0;
  pcStack_e30 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:246:7)>
                ::_M_invoke;
  local_e38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:246:7)>
              ::_M_manager;
  local_e48._M_unused._M_object = this;
  add(this,&local_438,&local_418,&local_3f8,(string *)local_58,&local_ae8,Zero,(Action *)&local_e48)
  ;
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"--in-secondary-memory","");
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_398,
             "Store profile information in a separate memory, rather than in module main memory or globals (the default). With this option, users do not need to reserve the initial memory region for profile data and the data can be shared between multiple threads."
             ,"");
  local_c5c[0xd] = 1;
  __l_13._M_len = 1;
  __l_13._M_array = local_c5c + 0xd;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_ad0,__l_13,&local_5f);
  local_e28._8_8_ = 0;
  pcStack_e10 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:259:7)>
                ::_M_invoke;
  local_e18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:259:7)>
              ::_M_manager;
  local_e28._M_unused._M_object = this;
  add(this,&local_3d8,&local_3b8,&local_398,(string *)local_58,&local_ad0,Zero,(Action *)&local_e28)
  ;
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"--secondary-memory-name","")
  ;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"");
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,
             "The name of the secondary memory created to store profile information.","");
  local_c5c[0xe] = 1;
  __l_14._M_len = 1;
  __l_14._M_array = local_c5c + 0xe;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_ab8,__l_14,&local_5e);
  local_e08._8_8_ = 0;
  pcStack_df0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:269:10)>
                ::_M_invoke;
  local_df8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:269:10)>
              ::_M_manager;
  local_e08._M_unused._M_object = this;
  add(this,&local_378,&local_358,&local_338,(string *)local_58,&local_ab8,One,(Action *)&local_e08);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"--emit-module-names","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,
             "Emit module names, even if not emitting the rest of the names section. Can help differentiate the modules in stack traces. This option will be removed once simpler ways of naming modules are widely available. See https://bugs.chromium.org/p/v8/issues/detail?id=11808."
             ,"");
  local_1078[2] = Split;
  local_1078[3] = Instrument;
  __l_15._M_len = 2;
  __l_15._M_array = local_1078 + 2;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_aa0,__l_15,&local_5d);
  local_de8._8_8_ = 0;
  pcStack_dd0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:282:7)>
                ::_M_invoke;
  local_dd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:282:7)>
              ::_M_manager;
  local_de8._M_unused._M_object = this;
  add(this,&local_318,&local_2f8,&local_2d8,(string *)local_58,&local_aa0,Zero,(Action *)&local_de8)
  ;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"--initial-table","");
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,
             "A hack to ensure the split and instrumented modules have the same table size when using Emscripten\'s SPLIT_MODULE mode with dynamic linking. TODO: Figure out a more elegant solution for that use case and remove this."
             ,"");
  local_1078[4] = Split;
  local_1078[5] = Instrument;
  __l_16._M_len = 2;
  __l_16._M_array = local_1078 + 4;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_a88,__l_16,&local_5c);
  local_dc8._8_8_ = 0;
  pcStack_db0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:292:10)>
                ::_M_invoke;
  local_db8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:292:10)>
              ::_M_manager;
  local_dc8._M_unused._M_object = this;
  add(this,&local_2b8,&local_298,&local_278,(string *)local_58,&local_a88,One,(Action *)&local_dc8);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"--emit-text","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"-S","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"Emit text instead of binary for the output file or files.","");
  local_1078[6] = Split;
  local_1078[7] = Instrument;
  __l_17._M_len = 2;
  __l_17._M_array = local_1078 + 6;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_a70,__l_17,&local_5b);
  local_da8._8_8_ = 0;
  pcStack_d90 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:301:10)>
                ::_M_invoke;
  local_d98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:301:10)>
              ::_M_manager;
  local_da8._M_unused._M_object = this;
  add(this,&local_258,&local_238,&local_218,(string *)local_58,&local_a70,Zero,(Action *)&local_da8)
  ;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"--debuginfo","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"-g","");
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"Emit names section in wasm binary (or full debuginfo in wast)",""
            );
  local_1078[8] = Split;
  local_1078[9] = Instrument;
  __l_18._M_len = 2;
  __l_18._M_array = local_1078 + 8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_a58,__l_18,&local_5a);
  local_d88._8_8_ = 0;
  pcStack_d70 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:308:10)>
                ::_M_invoke;
  local_d78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:308:10)>
              ::_M_manager;
  local_d88._M_unused._M_object = this;
  add(this,&local_1f8,&local_1d8,&local_1b8,(string *)local_58,&local_a58,Zero,(Action *)&local_d88)
  ;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"--output","");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"-o","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Output file.","");
  local_1078[10] = Instrument;
  local_1078[0xb] = MergeProfiles;
  __l_19._M_len = 2;
  __l_19._M_array = local_1078 + 10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_a40,__l_19,&local_59);
  local_d68._8_8_ = 0;
  pcStack_d50 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:317:10)>
                ::_M_invoke;
  local_d58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:317:10)>
              ::_M_manager;
  local_d68._M_unused._M_object = this;
  add(this,&local_198,&local_178,&local_158,(string *)local_58,&local_a40,One,(Action *)&local_d68);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"--unescape","");
  local_ce0._M_dataplus._M_p = (pointer)&local_ce0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce0,"-u","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"Un-escape function names (in print-profile output)","");
  local_d48._8_8_ = 0;
  pcStack_d30 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:323:10)>
                ::_M_invoke;
  local_d38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:323:10)>
              ::_M_manager;
  local_d48._M_unused._M_object = this;
  add(this,&local_138,&local_ce0,&local_118,(string *)local_58,Zero,(Action *)&local_d48);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"--verbose","");
  local_cc0._M_dataplus._M_p = (pointer)&local_cc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc0,"-v","");
  local_ca0._M_dataplus._M_p = (pointer)&local_ca0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ca0,
             "Verbose output mode. Prints the functions that will be kept and split out when splitting a module."
             ,"");
  local_d28._8_8_ = 0;
  pcStack_d10 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:330:10)>
                ::_M_invoke;
  local_d18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:330:10)>
              ::_M_manager;
  local_d28._M_unused._M_object = this;
  add(this,&local_f8,&local_cc0,&local_ca0,(string *)local_58,Zero,(Action *)&local_d28);
  local_c80[0] = local_c70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c80,"INFILES","");
  uStack_d00 = 0;
  pcStack_cf0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:336:21)>
                ::_M_invoke;
  local_cf8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:336:21)>
              ::_M_manager;
  local_d08 = this;
  wasm::Options::add_positional((string *)this,(Arguments)local_c80,(function *)0x2);
  if (local_cf8 != (code *)0x0) {
    (*local_cf8)(&local_d08,&local_d08,3);
  }
  if (local_c80[0] != local_c70) {
    operator_delete(local_c80[0],local_c70[0] + 1);
  }
  if (local_d18 != (code *)0x0) {
    (*local_d18)(&local_d28,&local_d28,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != &local_ca0.field_2) {
    operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
    operator_delete(local_cc0._M_dataplus._M_p,local_cc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d38 != (code *)0x0) {
    (*local_d38)(&local_d48,&local_d48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0._M_dataplus._M_p != &local_ce0.field_2) {
    operator_delete(local_ce0._M_dataplus._M_p,local_ce0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_d58 != (code *)0x0) {
    (*local_d58)(&local_d68,&local_d68,__destroy_functor);
  }
  if (local_a40.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a40.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a40.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_d78 != (code *)0x0) {
    (*local_d78)(&local_d88,&local_d88,__destroy_functor);
  }
  if (local_a58.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a58.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a58.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a58.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d98 != (code *)0x0) {
    (*local_d98)(&local_da8,&local_da8,__destroy_functor);
  }
  if (local_a70.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a70.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a70.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a70.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_db8 != (code *)0x0) {
    (*local_db8)(&local_dc8,&local_dc8,__destroy_functor);
  }
  if (local_a88.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a88.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a88.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a88.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_dd8 != (code *)0x0) {
    (*local_dd8)(&local_de8,&local_de8,__destroy_functor);
  }
  if (local_aa0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_aa0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_aa0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_aa0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if (local_df8 != (code *)0x0) {
    (*local_df8)(&local_e08,&local_e08,__destroy_functor);
  }
  if (local_ab8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ab8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_ab8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_ab8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_e18 != (code *)0x0) {
    (*local_e18)(&local_e28,&local_e28,__destroy_functor);
  }
  if (local_ad0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ad0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_ad0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_ad0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if (local_e38 != (code *)0x0) {
    (*local_e38)(&local_e48,&local_e48,__destroy_functor);
  }
  if (local_ae8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ae8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_ae8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_ae8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (local_e58 != (code *)0x0) {
    (*local_e58)(&local_e68,&local_e68,__destroy_functor);
  }
  if (local_b00.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b00.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b00.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b00.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if (local_e78 != (code *)0x0) {
    (*local_e78)(&local_e88,&local_e88,__destroy_functor);
  }
  if (local_b18.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b18.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b18.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b18.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if (local_e98 != (code *)0x0) {
    (*local_e98)(&local_ea8,&local_ea8,__destroy_functor);
  }
  if (local_b30.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b30.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b30.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b30.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if (local_eb8 != (code *)0x0) {
    (*local_eb8)(&local_ec8,&local_ec8,__destroy_functor);
  }
  if (local_b48.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b48.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b48.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b48.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if (local_ed8 != (code *)0x0) {
    (*local_ed8)(&local_ee8,&local_ee8,__destroy_functor);
  }
  if (local_b60.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b60.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b60.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b60.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if (local_ef8 != (code *)0x0) {
    (*local_ef8)(&local_f08,&local_f08,__destroy_functor);
  }
  if (local_b78.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b78.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b78.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b78.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if (local_f18 != (code *)0x0) {
    (*local_f18)(&local_f28,&local_f28,__destroy_functor);
  }
  if (local_b90.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b90.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b90.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b90.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f38 != (code *)0x0) {
    (*local_f38)(&local_f48,&local_f48,__destroy_functor);
  }
  if (local_ba8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ba8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_ba8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_ba8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if (local_f58 != (code *)0x0) {
    (*local_f58)(&local_f68,&local_f68,__destroy_functor);
  }
  if (local_bc0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_bc0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_bc0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if (local_f78 != (code *)0x0) {
    (*local_f78)(&local_f88,&local_f88,__destroy_functor);
  }
  if (local_bd8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bd8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_bd8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_bd8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if (local_f98 != (code *)0x0) {
    (*local_f98)(&local_fa8,&local_fa8,__destroy_functor);
  }
  if (local_bf0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bf0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_bf0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_bf0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
  }
  if (local_fb8 != (code *)0x0) {
    (*local_fb8)(&local_fc8,&local_fc8,__destroy_functor);
  }
  if (local_c08.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c08.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c08.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c08.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  if (local_fd8 != (code *)0x0) {
    (*local_fd8)(&local_fe8,&local_fe8,__destroy_functor);
  }
  if (local_c20.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c20.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c20.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c20.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  if (local_ff8 != (code *)0x0) {
    (*local_ff8)(&local_1008,&local_1008,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  if (local_1018 != (code *)0x0) {
    (*local_1018)(&local_1028,&local_1028,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
  }
  if (local_1038 != (code *)0x0) {
    (*local_1038)(&local_1048,&local_1048,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
    operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != (undefined1  [8])&WasmSplitOption._M_string_length) {
    operator_delete((void *)local_58,WasmSplitOption._M_string_length + 1);
  }
  return;
}

Assistant:

WasmSplitOptions::WasmSplitOptions()
  : ToolOptions("wasm-split",
                "Split a module into a primary module and a secondary "
                "module, or instrument a module to gather a profile that "
                "can inform future splitting, or manage such profiles. Options "
                "that are only accepted in particular modes are marked with "
                "the accepted \"[<modes>]\" in their descriptions.") {
  const std::string WasmSplitOption = "wasm-split options";

  (*this)
    .add("--split",
         "",
         "Split an input module into two output modules. The default mode.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arugment) { mode = Mode::Split; })
    .add(
      "--instrument",
      "",
      "Instrument an input module to allow it to generate a profile that can"
      " be used to guide splitting.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::Instrument; })
    .add("--merge-profiles",
         "",
         "Merge multiple profiles for the same module into a single profile.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           mode = Mode::MergeProfiles;
         })
    .add("--print-profile",
         "",
         "Print profile contents in a human-readable format.",
         WasmSplitOption,
         {Mode::PrintProfile},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           mode = Mode::PrintProfile;
           profileFile = argument;
         })
    .add(
      "--profile",
      "",
      "The profile to use to guide splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { profileFile = argument; })
    .add("--keep-funcs",
         "",
         "Comma-separated list of functions to keep in the primary module. The "
         "rest will be split out. Cannot be used with --profile or "
         "--split-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           keepFuncs = parseNameList(argument);
         })
    .add("--split-funcs",
         "",
         "Comma-separated list of functions to split out to the secondary "
         "module. The rest will be kept. Cannot be used with --profile or "
         "--keep-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           splitFuncs = parseNameList(argument);
         })
    .add("--primary-output",
         "-o1",
         "Output file for the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           primaryOutput = argument;
         })
    .add("--secondary-output",
         "-o2",
         "Output file for the secondary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryOutput = argument;
         })
    .add("--symbolmap",
         "",
         "Write a symbol map file for each of the output modules.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { symbolMap = true; })
    .add(
      "--placeholdermap",
      "",
      "Write a file mapping placeholder indices to the function names.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { placeholderMap = true; })
    .add("--import-namespace",
         "",
         "When provided as an option for module splitting, the namespace from "
         "which to import objects from the primary "
         "module into the secondary module. In instrument mode, refers to the "
         "namespace from which to import the secondary memory, if any.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           importNamespace = argument;
         })
    .add("--placeholder-namespace",
         "",
         "The namespace from which to import placeholder functions into "
         "the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           placeholderNamespace = argument;
         })
    .add("--jspi",
         "",
         "Transform the module to support asynchronously loading the secondary "
         "module before any placeholder functions have been called.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { jspi = true; })
    .add(
      "--export-prefix",
      "",
      "An identifying prefix to prepend to new export names created "
      "by module splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { exportPrefix = argument; })
    .add("--profile-export",
         "",
         "The export name of the function the embedder calls to write the "
         "profile into memory. Defaults to `__write_profile`.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           profileExport = argument;
         })
    .add(
      "--in-memory",
      "",
      "Store profile information in memory (starting at address 0 and taking "
      "one byte per function) rather than globals (the default) so that "
      "it can be shared between multiple threads. Users are responsible for "
      "ensuring that the module does not use the initial memory region for "
      "anything else.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InMemory;
      })
    .add(
      "--in-secondary-memory",
      "",
      "Store profile information in a separate memory, rather than in module "
      "main memory or globals (the default). With this option, users do not "
      "need to reserve the initial memory region for profile data and the "
      "data can be shared between multiple threads.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InSecondaryMemory;
      })
    .add("--secondary-memory-name",
         "",
         "The name of the secondary memory created to store profile "
         "information.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryMemoryName = argument;
         })
    .add(
      "--emit-module-names",
      "",
      "Emit module names, even if not emitting the rest of the names section. "
      "Can help differentiate the modules in stack traces. This option will be "
      "removed once simpler ways of naming modules are widely available. See "
      "https://bugs.chromium.org/p/v8/issues/detail?id=11808.",
      WasmSplitOption,
      {Mode::Split, Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& arguments) { emitModuleNames = true; })
    .add("--initial-table",
         "",
         "A hack to ensure the split and instrumented modules have the same "
         "table size when using Emscripten's SPLIT_MODULE mode with dynamic "
         "linking. TODO: Figure out a more elegant solution for that use "
         "case and remove this.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           initialTableSize = std::stoi(argument);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file or files.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) {
           passOptions.debugInfo = true;
         })
    .add("--output",
         "-o",
         "Output file.",
         WasmSplitOption,
         {Mode::Instrument, Mode::MergeProfiles},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { output = argument; })
    .add("--unescape",
         "-u",
         "Un-escape function names (in print-profile output)",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { unescape = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode. Prints the functions that will be kept "
         "and split out when splitting a module.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           verbose = true;
           quiet = false;
         })
    .add_positional("INFILES",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      inputFiles.push_back(argument);
                    });
}